

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Cube::setupFrontFace(Cube *this)

{
  float local_58;
  float local_54;
  float frontFace [18];
  Cube *this_local;
  
  local_58 = this->x;
  local_54 = this->y;
  frontFace[0] = this->z + this->b;
  frontFace[1] = this->x + this->l;
  frontFace[2] = this->y;
  frontFace[3] = this->z + this->b;
  frontFace[4] = this->x + this->l;
  frontFace[5] = this->y + this->h;
  frontFace[6] = this->z + this->b;
  frontFace[7] = this->x + this->l;
  frontFace[8] = this->y + this->h;
  frontFace[9] = this->z + this->b;
  frontFace[10] = this->x;
  frontFace[0xb] = this->y;
  frontFace[0xc] = this->z + this->b;
  frontFace[0xd] = this->x;
  frontFace[0xe] = this->y + this->h;
  frontFace[0xf] = this->z + this->b;
  frontFace._64_8_ = this;
  arrayCopy(this,&local_58,this->positionData,0);
  return;
}

Assistant:

void setupFrontFace() {
        float frontFace[]={
            x,y,z+b,
            x+l,y,z+b,
            x+l,y+h,z+b,
            x+l,y+h,z+b,
            x,y,z+b,
            x,y+h,z+b

        };

        arrayCopy(frontFace,positionData,0);
    }